

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cpp
# Opt level: O0

string * base64_decode(string *encoded_string)

{
  int iVar1;
  char cVar2;
  char *pcVar3;
  ulong in_RSI;
  string *in_RDI;
  uchar char_array_3 [3];
  uchar char_array_4 [4];
  int in_;
  int j;
  int i;
  int in_len;
  string *ret;
  bool local_49;
  char local_27 [7];
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  ulong local_10;
  
  local_10 = in_RSI;
  local_14 = std::__cxx11::string::size();
  local_18 = 0;
  local_1c = 0;
  local_20 = 0;
  std::__cxx11::string::string((string *)in_RDI);
  while( true ) {
    iVar1 = local_14;
    local_14 = local_14 + -1;
    local_49 = false;
    if (iVar1 != 0) {
      pcVar3 = (char *)std::__cxx11::string::operator[](local_10);
      local_49 = false;
      if (*pcVar3 != '=') {
        std::__cxx11::string::operator[](local_10);
        local_49 = is_base64('\0');
      }
    }
    if (local_49 == false) break;
    pcVar3 = (char *)std::__cxx11::string::operator[](local_10);
    iVar1 = local_18;
    local_18 = local_18 + 1;
    local_27[(long)iVar1 + 3] = *pcVar3;
    local_20 = local_20 + 1;
    if (local_18 == 4) {
      for (local_18 = 0; local_18 < 4; local_18 = local_18 + 1) {
        cVar2 = std::__cxx11::string::find('X',(ulong)(uint)(int)local_27[(long)local_18 + 3]);
        local_27[(long)local_18 + 3] = cVar2;
      }
      local_27[0] = local_27[3] * '\x04' + (char)((int)((byte)local_27[4] & 0x30) >> 4);
      local_27[1] = local_27[4] * '\x10' + (char)((int)((byte)local_27[5] & 0x3c) >> 2);
      local_27[2] = local_27[5] * '@' + local_27[6];
      for (local_18 = 0; local_18 < 3; local_18 = local_18 + 1) {
        std::__cxx11::string::operator+=((string *)in_RDI,local_27[local_18]);
      }
      local_18 = 0;
    }
  }
  if (local_18 != 0) {
    for (local_1c = local_18; local_1c < 4; local_1c = local_1c + 1) {
      local_27[(long)local_1c + 3] = '\0';
    }
    for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
      cVar2 = std::__cxx11::string::find('X',(ulong)(uint)(int)local_27[(long)local_1c + 3]);
      local_27[(long)local_1c + 3] = cVar2;
    }
    local_27[0] = local_27[3] * '\x04' + (char)((int)((byte)local_27[4] & 0x30) >> 4);
    local_27[1] = local_27[4] * '\x10' + (char)((int)((byte)local_27[5] & 0x3c) >> 2);
    local_27[2] = local_27[5] * '@' + local_27[6];
    for (local_1c = 0; local_1c < local_18 + -1; local_1c = local_1c + 1) {
      std::__cxx11::string::operator+=((string *)in_RDI,local_27[local_1c]);
    }
  }
  return in_RDI;
}

Assistant:

std::string base64_decode(std::string const& encoded_string) {
  int in_len = encoded_string.size();
  int i = 0;
  int j = 0;
  int in_ = 0;
  unsigned char char_array_4[4], char_array_3[3];
  std::string ret;

  while (in_len-- && ( encoded_string[in_] != '=') && is_base64(encoded_string[in_])) {
    char_array_4[i++] = encoded_string[in_]; in_++;
    if (i ==4) {
      for (i = 0; i <4; i++)
        char_array_4[i] = base64_chars.find(char_array_4[i]);

      char_array_3[0] = (char_array_4[0] << 2) + ((char_array_4[1] & 0x30) >> 4);
      char_array_3[1] = ((char_array_4[1] & 0xf) << 4) + ((char_array_4[2] & 0x3c) >> 2);
      char_array_3[2] = ((char_array_4[2] & 0x3) << 6) + char_array_4[3];

      for (i = 0; (i < 3); i++)
        ret += char_array_3[i];
      i = 0;
    }
  }

  if (i) {
    for (j = i; j <4; j++)
      char_array_4[j] = 0;

    for (j = 0; j <4; j++)
      char_array_4[j] = base64_chars.find(char_array_4[j]);

    char_array_3[0] = (char_array_4[0] << 2) + ((char_array_4[1] & 0x30) >> 4);
    char_array_3[1] = ((char_array_4[1] & 0xf) << 4) + ((char_array_4[2] & 0x3c) >> 2);
    char_array_3[2] = ((char_array_4[2] & 0x3) << 6) + char_array_4[3];

    for (j = 0; (j < i - 1); j++) ret += char_array_3[j];
  }

  return ret;
}